

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::SetStockAlpha
          (ChElementHexaANCF_3813 *this,double a1,double a2,double a3,double a4,double a5,double a6,
          double a7,double a8,double a9)

{
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[0] = a1;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[1] = a2;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[2] = a3;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[3] = a4;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[4] = a5;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[5] = a6;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[6] = a7;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[7] = a8;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[8] = a9;
  return;
}

Assistant:

void ChElementHexaANCF_3813::SetStockAlpha(double a1,
                                           double a2,
                                           double a3,
                                           double a4,
                                           double a5,
                                           double a6,
                                           double a7,
                                           double a8,
                                           double a9) {
    m_stock_alpha_EAS(0) = a1;
    m_stock_alpha_EAS(1) = a2;
    m_stock_alpha_EAS(2) = a3;
    m_stock_alpha_EAS(3) = a4;
    m_stock_alpha_EAS(4) = a5;
    m_stock_alpha_EAS(5) = a6;
    m_stock_alpha_EAS(6) = a7;
    m_stock_alpha_EAS(7) = a8;
    m_stock_alpha_EAS(8) = a9;
}